

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O1

VulkanRecycledFence * __thiscall
VulkanUtilities::VulkanSyncObjectManager::CreateFence
          (VulkanRecycledFence *__return_storage_ptr__,VulkanSyncObjectManager *this)

{
  mutex *__mutex;
  pointer ppVVar1;
  pointer ppVVar2;
  VkFence_T *pVVar3;
  int iVar4;
  VkFence vkFence;
  VkFenceCreateInfo FenceCI;
  element_type *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  VkFence local_50;
  VkFenceCreateInfo local_48;
  
  __mutex = &this->m_FencePoolGuard;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  ppVVar1 = (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVVar2 = (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppVVar1 == ppVVar2) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    pVVar3 = ppVVar2[-1];
    (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar2 + -1;
    std::__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<VulkanUtilities::VulkanSyncObjectManager,void>
              ((__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2> *)
               &local_70,
               (__weak_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2> *)
               this);
    (__return_storage_ptr__->m_pManager).
    super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = local_70;
    (__return_storage_ptr__->m_pManager).
    super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_68;
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_68->_M_use_count = local_68->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_68->_M_use_count = local_68->_M_use_count + 1;
      }
    }
    __return_storage_ptr__->m_VkSyncObject = pVVar3;
    __return_storage_ptr__->m_IsUnsignaled = false;
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (ppVVar1 != ppVVar2) {
      return __return_storage_ptr__;
    }
  }
  local_48.pNext = (void *)0x0;
  local_48.flags = 0;
  local_48._20_4_ = 0;
  local_50 = (NativeType)0x0;
  local_48.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  local_48._4_4_ = 0;
  (*vkCreateFence)(this->m_LogicalDevice->m_VkDevice,&local_48,(VkAllocationCallbacks *)0x0,
                   &local_50);
  std::__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<VulkanUtilities::VulkanSyncObjectManager,void>
            ((__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2> *)
             &local_60,
             (__weak_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2> *)
             this);
  (__return_storage_ptr__->m_pManager).
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_60;
  (__return_storage_ptr__->m_pManager).
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_58;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  __return_storage_ptr__->m_VkSyncObject = local_50;
  __return_storage_ptr__->m_IsUnsignaled = false;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

VulkanRecycledFence VulkanSyncObjectManager::CreateFence()
{
    {
        std::lock_guard<std::mutex> Lock{m_FencePoolGuard};

        if (!m_FencePool.empty())
        {
            auto vkFence = m_FencePool.back();
            m_FencePool.pop_back();
            return {shared_from_this(), vkFence};
        }
    }

    VkFenceCreateInfo FenceCI = {};
    VkFence           vkFence = VK_NULL_HANDLE;

    FenceCI.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
    vkCreateFence(m_LogicalDevice.GetVkDevice(), &FenceCI, nullptr, &vkFence);

    return {shared_from_this(), vkFence};
}